

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase272::run(TestCase272 *this)

{
  StructDataBitCount *this_00;
  bool bVar1;
  ReaderFor<bool> RVar2;
  BuilderFor<bool> BVar3;
  ReaderFor<int> RVar4;
  BuilderFor<int> BVar5;
  NullableValue<capnp::StructSchema::Field> *pNVar6;
  Field *pFVar7;
  ReaderFor<long> RVar8;
  BuilderFor<long> BVar9;
  Builder *extraout_RDX;
  Builder *extraout_RDX_00;
  Builder *value;
  Builder *extraout_RDX_01;
  ArrayPtr<const_char> AVar10;
  ArrayPtr<const_char> local_1518;
  Builder local_1508;
  BuilderFor<long> local_14c8;
  longlong local_14c0;
  bool local_14b1;
  undefined1 auStack_14b0 [7];
  bool _kj_shouldLog_23;
  Builder local_14a0;
  bool local_1459;
  undefined1 local_1458 [7];
  bool _kj_shouldLog_22;
  ArrayPtr<const_char> local_1428;
  bool local_1411;
  undefined1 local_1410 [7];
  bool _kj_shouldLog_21;
  ArrayPtr<const_char> local_13e0;
  Maybe<capnp::StructSchema::Field> local_13d0;
  undefined1 local_1388 [8];
  NullableValue<capnp::StructSchema::Field> w_7;
  Builder local_1330;
  undefined1 local_12f0 [8];
  BuilderFor<capnp::DynamicStruct> u_7;
  undefined1 auStack_12b8 [7];
  bool _kj_shouldLog_20;
  Builder local_12a8;
  bool local_1261;
  undefined1 local_1260 [7];
  bool _kj_shouldLog_19;
  ArrayPtr<const_char> local_1230;
  bool local_1219;
  undefined1 local_1218 [7];
  bool _kj_shouldLog_18;
  ArrayPtr<const_char> local_11e8;
  Maybe<capnp::StructSchema::Field> local_11d8;
  undefined1 local_1190 [8];
  NullableValue<capnp::StructSchema::Field> w_6;
  Builder local_1138;
  undefined1 local_10f8 [8];
  BuilderFor<capnp::DynamicStruct> u_6;
  Builder local_10b8;
  BuilderFor<capnp::Text> local_1078;
  bool local_1059;
  undefined1 auStack_1058 [7];
  bool _kj_shouldLog_17;
  Builder local_1048;
  BuilderFor<capnp::Text> local_1008;
  bool local_fe9;
  undefined1 local_fe8 [7];
  bool _kj_shouldLog_16;
  ArrayPtr<const_char> local_fb8;
  bool local_fa1;
  undefined1 local_fa0 [7];
  bool _kj_shouldLog_15;
  ArrayPtr<const_char> local_f70;
  Maybe<capnp::StructSchema::Field> local_f60;
  undefined1 local_f18 [8];
  NullableValue<capnp::StructSchema::Field> w_5;
  Builder local_ec0;
  undefined1 local_e80 [8];
  BuilderFor<capnp::DynamicStruct> u_5;
  Builder local_e40;
  BuilderFor<int> local_dfc;
  int local_df8;
  bool local_df1;
  undefined1 auStack_df0 [7];
  bool _kj_shouldLog_14;
  Builder local_de0;
  bool local_d99;
  undefined1 local_d98 [7];
  bool _kj_shouldLog_13;
  ArrayPtr<const_char> local_d68;
  bool local_d51;
  undefined1 local_d50 [7];
  bool _kj_shouldLog_12;
  ArrayPtr<const_char> local_d20;
  Maybe<capnp::StructSchema::Field> local_d10;
  undefined1 local_cc8 [8];
  NullableValue<capnp::StructSchema::Field> w_4;
  Builder local_c70;
  undefined1 local_c30 [8];
  BuilderFor<capnp::DynamicStruct> u_4;
  BuilderFor<DynamicTypeFor<FromBuilder<Builder_&>_>_>_conflict dynamic_1;
  Reader local_bc0;
  ReaderFor<long> local_b78;
  longlong local_b70;
  bool local_b61;
  undefined1 auStack_b60 [7];
  bool _kj_shouldLog_11;
  Reader local_b50;
  bool local_b01;
  undefined1 local_b00 [7];
  bool _kj_shouldLog_10;
  ArrayPtr<const_char> local_ad0;
  bool local_ab9;
  undefined1 local_ab8 [7];
  bool _kj_shouldLog_9;
  ArrayPtr<const_char> local_a88;
  Maybe<capnp::StructSchema::Field> local_a78;
  undefined1 local_a30 [8];
  NullableValue<capnp::StructSchema::Field> w_3;
  Reader local_9d8;
  undefined1 local_990 [8];
  ReaderFor<capnp::DynamicStruct> u_3;
  undefined1 auStack_950 [7];
  bool _kj_shouldLog_8;
  Reader local_940;
  bool local_8f1;
  undefined1 local_8f0 [7];
  bool _kj_shouldLog_7;
  ArrayPtr<const_char> local_8c0;
  bool local_8a9;
  undefined1 local_8a8 [7];
  bool _kj_shouldLog_6;
  ArrayPtr<const_char> local_878;
  Maybe<capnp::StructSchema::Field> local_868;
  undefined1 local_820 [8];
  NullableValue<capnp::StructSchema::Field> w_2;
  Reader local_7c8;
  undefined1 local_780 [8];
  ReaderFor<capnp::DynamicStruct> u_2;
  Reader local_738;
  ArrayPtr<const_char> local_6f0;
  bool local_6d9;
  undefined1 auStack_6d8 [7];
  bool _kj_shouldLog_5;
  Reader local_6c8;
  ArrayPtr<const_char> local_680;
  bool local_669;
  undefined1 local_668 [7];
  bool _kj_shouldLog_4;
  ArrayPtr<const_char> local_638;
  bool local_621;
  undefined1 local_620 [7];
  bool _kj_shouldLog_3;
  ArrayPtr<const_char> local_5f0;
  Maybe<capnp::StructSchema::Field> local_5e0;
  undefined1 local_598 [8];
  NullableValue<capnp::StructSchema::Field> w_1;
  Reader local_540;
  undefined1 local_4f8 [8];
  ReaderFor<capnp::DynamicStruct> u_1;
  Reader local_4b0;
  ReaderFor<int> local_464;
  int local_460;
  bool local_459;
  undefined1 auStack_458 [7];
  bool _kj_shouldLog_2;
  Reader local_448;
  bool local_3f9;
  undefined1 local_3f8 [7];
  bool _kj_shouldLog_1;
  ArrayPtr<const_char> local_3c8;
  bool local_3b1;
  undefined1 local_3b0 [7];
  bool _kj_shouldLog;
  ArrayPtr<const_char> local_380;
  Maybe<capnp::StructSchema::Field> local_370;
  undefined1 local_328 [8];
  NullableValue<capnp::StructSchema::Field> w;
  Reader local_2d0;
  undefined1 local_288 [8];
  ReaderFor<capnp::DynamicStruct> u;
  undefined1 local_220 [8];
  ReaderFor<DynamicTypeFor<FromReader<Reader>_>_> dynamic;
  Builder local_1c0;
  ArrayPtr<const_char> local_198;
  Builder local_188;
  Builder local_160;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase272 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestUnion>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestUnion::Builder::getUnion0(&local_160,(Builder *)local_128);
  capnproto_test::capnp::test::TestUnion::Union0::Builder::setU0f1s32(&local_160,0x12d687);
  capnproto_test::capnp::test::TestUnion::Builder::getUnion1(&local_188,(Builder *)local_128);
  Text::Reader::Reader((Reader *)&local_198,"foo");
  capnproto_test::capnp::test::TestUnion::Union1::Builder::setU1f1sp(&local_188,(Reader)local_198);
  capnproto_test::capnp::test::TestUnion::Builder::getUnion2(&local_1c0,(Builder *)local_128);
  capnproto_test::capnp::test::TestUnion::Union2::Builder::setU2f0s1(&local_1c0,true);
  capnproto_test::capnp::test::TestUnion::Builder::getUnion3
            ((Builder *)&dynamic.reader.nestingLimit,(Builder *)local_128);
  capnproto_test::capnp::test::TestUnion::Union3::Builder::setU3f0s64
            ((Builder *)&dynamic.reader.nestingLimit,0x112210f47de98115);
  capnproto_test::capnp::test::TestUnion::Builder::asReader
            ((Reader *)&u.reader.nestingLimit,(Builder *)local_128);
  toDynamic<capnproto_test::capnp::test::TestUnion::Reader>
            ((ReaderFor<DynamicTypeFor<FromReader<Reader>_>_> *)local_220,
             (Reader *)&u.reader.nestingLimit);
  kj::StringPtr::StringPtr((StringPtr *)&w.field_1.value.proto._reader.nestingLimit,"union0");
  DynamicStruct::Reader::get(&local_2d0,(Reader *)local_220,(StringPtr)stack0xfffffffffffffd20);
  DynamicValue::Reader::as<capnp::DynamicStruct>
            ((ReaderFor<capnp::DynamicStruct> *)local_288,&local_2d0);
  DynamicValue::Reader::~Reader(&local_2d0);
  DynamicStruct::Reader::which(&local_370,(Reader *)local_288);
  pNVar6 = kj::_::readMaybe<capnp::StructSchema::Field>(&local_370);
  kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)local_328,pNVar6);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_370);
  pFVar7 = kj::_::NullableValue::operator_cast_to_Field_((NullableValue *)local_328);
  if (pFVar7 == (Field *)0x0) {
    local_3f9 = kj::_::Debug::shouldLog(ERROR);
    while( true ) {
      if (local_3f9 == false) break;
      kj::_::Debug::log<char_const(&)[17]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x11d,ERROR,"\"Maybe was empty.\"",(char (*) [17])"Maybe was empty.");
      local_3f9 = false;
    }
  }
  else {
    pFVar7 = kj::_::NullableValue<capnp::StructSchema::Field>::operator->
                       ((NullableValue<capnp::StructSchema::Field> *)local_328);
    StructSchema::Field::getProto((Reader *)local_3b0,pFVar7);
    local_380 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)local_3b0);
    bVar1 = kj::operator==("u0f1s32",(StringPtr *)&local_380);
    if (!bVar1) {
      local_3b1 = kj::_::Debug::shouldLog(ERROR);
      while (local_3b1 != false) {
        pFVar7 = kj::_::NullableValue<capnp::StructSchema::Field>::operator->
                           ((NullableValue<capnp::StructSchema::Field> *)local_328);
        StructSchema::Field::getProto((Reader *)local_3f8,pFVar7);
        AVar10 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)local_3f8);
        local_3c8 = AVar10;
        kj::_::Debug::log<char_const(&)[58],char_const(&)[8],capnp::Text::Reader>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0x11d,ERROR,
                   "\"failed: expected \" \"(\\\"u0f1s32\\\") == (w->getProto().getName())\", \"u0f1s32\", w->getProto().getName()"
                   ,(char (*) [58])"failed: expected (\"u0f1s32\") == (w->getProto().getName())",
                   (char (*) [8])"u0f1s32",(Reader *)&local_3c8);
        local_3b1 = false;
      }
    }
  }
  kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)local_328);
  kj::StringPtr::StringPtr((StringPtr *)auStack_458,"u0f1s32");
  DynamicStruct::Reader::get(&local_448,(Reader *)local_288,(StringPtr)_auStack_458);
  RVar4 = DynamicValue::Reader::as<int>(&local_448);
  DynamicValue::Reader::~Reader(&local_448);
  if (RVar4 != 0x12d687) {
    local_459 = kj::_::Debug::shouldLog(ERROR);
    while (local_459 != false) {
      local_460 = 0x12d687;
      kj::StringPtr::StringPtr((StringPtr *)&u_1.reader.nestingLimit,"u0f1s32");
      DynamicStruct::Reader::get(&local_4b0,(Reader *)local_288,(StringPtr)stack0xfffffffffffffb40);
      local_464 = DynamicValue::Reader::as<int>(&local_4b0);
      kj::_::Debug::log<char_const(&)[63],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x11e,ERROR,
                 "\"failed: expected \" \"(1234567) == (u.get(\\\"u0f1s32\\\").as<int32_t>())\", 1234567, u.get(\"u0f1s32\").as<int32_t>()"
                 ,(char (*) [63])"failed: expected (1234567) == (u.get(\"u0f1s32\").as<int32_t>())",
                 &local_460,&local_464);
      DynamicValue::Reader::~Reader(&local_4b0);
      local_459 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&w_1.field_1.value.proto._reader.nestingLimit,"union1");
  DynamicStruct::Reader::get(&local_540,(Reader *)local_220,(StringPtr)stack0xfffffffffffffab0);
  DynamicValue::Reader::as<capnp::DynamicStruct>
            ((ReaderFor<capnp::DynamicStruct> *)local_4f8,&local_540);
  DynamicValue::Reader::~Reader(&local_540);
  DynamicStruct::Reader::which(&local_5e0,(Reader *)local_4f8);
  pNVar6 = kj::_::readMaybe<capnp::StructSchema::Field>(&local_5e0);
  kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)local_598,pNVar6);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_5e0);
  pFVar7 = kj::_::NullableValue::operator_cast_to_Field_((NullableValue *)local_598);
  if (pFVar7 == (Field *)0x0) {
    local_669 = kj::_::Debug::shouldLog(ERROR);
    while( true ) {
      if (local_669 == false) break;
      kj::_::Debug::log<char_const(&)[17]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x122,ERROR,"\"Maybe was empty.\"",(char (*) [17])"Maybe was empty.");
      local_669 = false;
    }
  }
  else {
    pFVar7 = kj::_::NullableValue<capnp::StructSchema::Field>::operator->
                       ((NullableValue<capnp::StructSchema::Field> *)local_598);
    StructSchema::Field::getProto((Reader *)local_620,pFVar7);
    local_5f0 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)local_620);
    bVar1 = kj::operator==("u1f1sp",(StringPtr *)&local_5f0);
    if (!bVar1) {
      local_621 = kj::_::Debug::shouldLog(ERROR);
      while (local_621 != false) {
        pFVar7 = kj::_::NullableValue<capnp::StructSchema::Field>::operator->
                           ((NullableValue<capnp::StructSchema::Field> *)local_598);
        StructSchema::Field::getProto((Reader *)local_668,pFVar7);
        AVar10 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)local_668);
        local_638 = AVar10;
        kj::_::Debug::log<char_const(&)[57],char_const(&)[7],capnp::Text::Reader>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0x122,ERROR,
                   "\"failed: expected \" \"(\\\"u1f1sp\\\") == (w->getProto().getName())\", \"u1f1sp\", w->getProto().getName()"
                   ,(char (*) [57])"failed: expected (\"u1f1sp\") == (w->getProto().getName())",
                   (char (*) [7])"u1f1sp",(Reader *)&local_638);
        local_621 = false;
      }
    }
  }
  kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)local_598);
  kj::StringPtr::StringPtr((StringPtr *)auStack_6d8,"u1f1sp");
  DynamicStruct::Reader::get(&local_6c8,(Reader *)local_4f8,(StringPtr)_auStack_6d8);
  local_680 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_6c8);
  bVar1 = kj::operator==("foo",(StringPtr *)&local_680);
  DynamicValue::Reader::~Reader(&local_6c8);
  if (!bVar1) {
    local_6d9 = kj::_::Debug::shouldLog(ERROR);
    while (local_6d9 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&u_2.reader.nestingLimit,"u1f1sp");
      DynamicStruct::Reader::get(&local_738,(Reader *)local_4f8,(StringPtr)stack0xfffffffffffff8b8);
      AVar10 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_738);
      local_6f0 = AVar10;
      kj::_::Debug::log<char_const(&)[57],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x123,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (u.get(\\\"u1f1sp\\\").as<Text>())\", \"foo\", u.get(\"u1f1sp\").as<Text>()"
                 ,(char (*) [57])"failed: expected (\"foo\") == (u.get(\"u1f1sp\").as<Text>())",
                 (char (*) [4])0xa4c8db,(Reader *)&local_6f0);
      DynamicValue::Reader::~Reader(&local_738);
      local_6d9 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&w_2.field_1.value.proto._reader.nestingLimit,"union2");
  DynamicStruct::Reader::get(&local_7c8,(Reader *)local_220,(StringPtr)stack0xfffffffffffff828);
  DynamicValue::Reader::as<capnp::DynamicStruct>
            ((ReaderFor<capnp::DynamicStruct> *)local_780,&local_7c8);
  DynamicValue::Reader::~Reader(&local_7c8);
  DynamicStruct::Reader::which(&local_868,(Reader *)local_780);
  pNVar6 = kj::_::readMaybe<capnp::StructSchema::Field>(&local_868);
  kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)local_820,pNVar6);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_868);
  pFVar7 = kj::_::NullableValue::operator_cast_to_Field_((NullableValue *)local_820);
  if (pFVar7 == (Field *)0x0) {
    local_8f1 = kj::_::Debug::shouldLog(ERROR);
    while( true ) {
      if (local_8f1 == false) break;
      kj::_::Debug::log<char_const(&)[17]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x127,ERROR,"\"Maybe was empty.\"",(char (*) [17])"Maybe was empty.");
      local_8f1 = false;
    }
  }
  else {
    pFVar7 = kj::_::NullableValue<capnp::StructSchema::Field>::operator->
                       ((NullableValue<capnp::StructSchema::Field> *)local_820);
    StructSchema::Field::getProto((Reader *)local_8a8,pFVar7);
    local_878 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)local_8a8);
    bVar1 = kj::operator==("u2f0s1",(StringPtr *)&local_878);
    if (!bVar1) {
      local_8a9 = kj::_::Debug::shouldLog(ERROR);
      while (local_8a9 != false) {
        pFVar7 = kj::_::NullableValue<capnp::StructSchema::Field>::operator->
                           ((NullableValue<capnp::StructSchema::Field> *)local_820);
        StructSchema::Field::getProto((Reader *)local_8f0,pFVar7);
        AVar10 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)local_8f0);
        local_8c0 = AVar10;
        kj::_::Debug::log<char_const(&)[57],char_const(&)[7],capnp::Text::Reader>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0x127,ERROR,
                   "\"failed: expected \" \"(\\\"u2f0s1\\\") == (w->getProto().getName())\", \"u2f0s1\", w->getProto().getName()"
                   ,(char (*) [57])"failed: expected (\"u2f0s1\") == (w->getProto().getName())",
                   (char (*) [7])"u2f0s1",(Reader *)&local_8c0);
        local_8a9 = false;
      }
    }
  }
  kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)local_820);
  kj::StringPtr::StringPtr((StringPtr *)auStack_950,"u2f0s1");
  DynamicStruct::Reader::get(&local_940,(Reader *)local_780,(StringPtr)_auStack_950);
  RVar2 = DynamicValue::Reader::as<bool>(&local_940);
  DynamicValue::Reader::~Reader(&local_940);
  if (!RVar2) {
    u_3.reader._47_1_ = kj::_::Debug::shouldLog(ERROR);
    while (u_3.reader._47_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[44]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x128,ERROR,"\"failed: expected \" \"u.get(\\\"u2f0s1\\\").as<bool>()\"",
                 (char (*) [44])"failed: expected u.get(\"u2f0s1\").as<bool>()");
      u_3.reader._47_1_ = 0;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&w_3.field_1.value.proto._reader.nestingLimit,"union3");
  DynamicStruct::Reader::get(&local_9d8,(Reader *)local_220,(StringPtr)stack0xfffffffffffff618);
  DynamicValue::Reader::as<capnp::DynamicStruct>
            ((ReaderFor<capnp::DynamicStruct> *)local_990,&local_9d8);
  DynamicValue::Reader::~Reader(&local_9d8);
  DynamicStruct::Reader::which(&local_a78,(Reader *)local_990);
  pNVar6 = kj::_::readMaybe<capnp::StructSchema::Field>(&local_a78);
  kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)local_a30,pNVar6);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_a78);
  pFVar7 = kj::_::NullableValue::operator_cast_to_Field_((NullableValue *)local_a30);
  if (pFVar7 == (Field *)0x0) {
    local_b01 = kj::_::Debug::shouldLog(ERROR);
    while( true ) {
      if (local_b01 == false) break;
      kj::_::Debug::log<char_const(&)[17]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,300,ERROR,"\"Maybe was empty.\"",(char (*) [17])"Maybe was empty.");
      local_b01 = false;
    }
  }
  else {
    pFVar7 = kj::_::NullableValue<capnp::StructSchema::Field>::operator->
                       ((NullableValue<capnp::StructSchema::Field> *)local_a30);
    StructSchema::Field::getProto((Reader *)local_ab8,pFVar7);
    local_a88 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)local_ab8);
    bVar1 = kj::operator==("u3f0s64",(StringPtr *)&local_a88);
    if (!bVar1) {
      local_ab9 = kj::_::Debug::shouldLog(ERROR);
      while (local_ab9 != false) {
        pFVar7 = kj::_::NullableValue<capnp::StructSchema::Field>::operator->
                           ((NullableValue<capnp::StructSchema::Field> *)local_a30);
        StructSchema::Field::getProto((Reader *)local_b00,pFVar7);
        AVar10 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)local_b00);
        local_ad0 = AVar10;
        kj::_::Debug::log<char_const(&)[58],char_const(&)[8],capnp::Text::Reader>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,300,ERROR,
                   "\"failed: expected \" \"(\\\"u3f0s64\\\") == (w->getProto().getName())\", \"u3f0s64\", w->getProto().getName()"
                   ,(char (*) [58])"failed: expected (\"u3f0s64\") == (w->getProto().getName())",
                   (char (*) [8])"u3f0s64",(Reader *)&local_ad0);
        local_ab9 = false;
      }
    }
  }
  kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)local_a30);
  kj::StringPtr::StringPtr((StringPtr *)auStack_b60,"u3f0s64");
  DynamicStruct::Reader::get(&local_b50,(Reader *)local_990,(StringPtr)_auStack_b60);
  RVar8 = DynamicValue::Reader::as<long>(&local_b50);
  DynamicValue::Reader::~Reader(&local_b50);
  value = extraout_RDX;
  if (RVar8 != 0x112210f47de98115) {
    local_b61 = kj::_::Debug::shouldLog(ERROR);
    value = extraout_RDX_00;
    while (local_b61 != false) {
      local_b70 = 0x112210f47de98115;
      kj::StringPtr::StringPtr((StringPtr *)&dynamic_1.builder.dataSize,"u3f0s64");
      DynamicStruct::Reader::get(&local_bc0,(Reader *)local_990,(StringPtr)stack0xfffffffffffff430);
      local_b78 = DynamicValue::Reader::as<long>(&local_bc0);
      kj::_::Debug::log<char_const(&)[77],long_long,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x12d,ERROR,
                 "\"failed: expected \" \"(1234567890123456789ll) == (u.get(\\\"u3f0s64\\\").as<int64_t>())\", 1234567890123456789ll, u.get(\"u3f0s64\").as<int64_t>()"
                 ,(char (*) [77])
                  "failed: expected (1234567890123456789ll) == (u.get(\"u3f0s64\").as<int64_t>())",
                 &local_b70,&local_b78);
      DynamicValue::Reader::~Reader(&local_bc0);
      value = extraout_RDX_01;
      local_b61 = false;
    }
  }
  toDynamic<capnproto_test::capnp::test::TestUnion::Builder&>
            ((BuilderFor<DynamicTypeFor<FromBuilder<Builder_&>_>_>_conflict *)&u_4.builder.dataSize,
             (capnp *)local_128,value);
  kj::StringPtr::StringPtr((StringPtr *)&w_4.field_1.value.proto._reader.nestingLimit,"union0");
  DynamicStruct::Builder::get
            (&local_c70,(Builder *)&u_4.builder.dataSize,(StringPtr)stack0xfffffffffffff380);
  DynamicValue::Builder::as<capnp::DynamicStruct>
            ((BuilderFor<capnp::DynamicStruct> *)local_c30,&local_c70);
  DynamicValue::Builder::~Builder(&local_c70);
  DynamicStruct::Builder::which(&local_d10,(Builder *)local_c30);
  pNVar6 = kj::_::readMaybe<capnp::StructSchema::Field>(&local_d10);
  kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)local_cc8,pNVar6);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_d10);
  pFVar7 = kj::_::NullableValue::operator_cast_to_Field_((NullableValue *)local_cc8);
  if (pFVar7 == (Field *)0x0) {
    local_d99 = kj::_::Debug::shouldLog(ERROR);
    while( true ) {
      if (local_d99 == false) break;
      kj::_::Debug::log<char_const(&)[17]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x136,ERROR,"\"Maybe was empty.\"",(char (*) [17])"Maybe was empty.");
      local_d99 = false;
    }
  }
  else {
    pFVar7 = kj::_::NullableValue<capnp::StructSchema::Field>::operator->
                       ((NullableValue<capnp::StructSchema::Field> *)local_cc8);
    StructSchema::Field::getProto((Reader *)local_d50,pFVar7);
    local_d20 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)local_d50);
    bVar1 = kj::operator==("u0f1s32",(StringPtr *)&local_d20);
    if (!bVar1) {
      local_d51 = kj::_::Debug::shouldLog(ERROR);
      while (local_d51 != false) {
        pFVar7 = kj::_::NullableValue<capnp::StructSchema::Field>::operator->
                           ((NullableValue<capnp::StructSchema::Field> *)local_cc8);
        StructSchema::Field::getProto((Reader *)local_d98,pFVar7);
        AVar10 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)local_d98);
        local_d68 = AVar10;
        kj::_::Debug::log<char_const(&)[58],char_const(&)[8],capnp::Text::Reader>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0x136,ERROR,
                   "\"failed: expected \" \"(\\\"u0f1s32\\\") == (w->getProto().getName())\", \"u0f1s32\", w->getProto().getName()"
                   ,(char (*) [58])"failed: expected (\"u0f1s32\") == (w->getProto().getName())",
                   (char (*) [8])"u0f1s32",(Reader *)&local_d68);
        local_d51 = false;
      }
    }
  }
  kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)local_cc8);
  kj::StringPtr::StringPtr((StringPtr *)auStack_df0,"u0f1s32");
  DynamicStruct::Builder::get(&local_de0,(Builder *)local_c30,(StringPtr)_auStack_df0);
  BVar5 = DynamicValue::Builder::as<int>(&local_de0);
  DynamicValue::Builder::~Builder(&local_de0);
  if (BVar5 != 0x12d687) {
    local_df1 = kj::_::Debug::shouldLog(ERROR);
    while (local_df1 != false) {
      local_df8 = 0x12d687;
      kj::StringPtr::StringPtr((StringPtr *)&u_5.builder.dataSize,"u0f1s32");
      DynamicStruct::Builder::get
                (&local_e40,(Builder *)local_c30,(StringPtr)stack0xfffffffffffff1b0);
      local_dfc = DynamicValue::Builder::as<int>(&local_e40);
      kj::_::Debug::log<char_const(&)[63],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x137,ERROR,
                 "\"failed: expected \" \"(1234567) == (u.get(\\\"u0f1s32\\\").as<int32_t>())\", 1234567, u.get(\"u0f1s32\").as<int32_t>()"
                 ,(char (*) [63])"failed: expected (1234567) == (u.get(\"u0f1s32\").as<int32_t>())",
                 &local_df8,&local_dfc);
      DynamicValue::Builder::~Builder(&local_e40);
      local_df1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&w_5.field_1.value.proto._reader.nestingLimit,"union1");
  DynamicStruct::Builder::get
            (&local_ec0,(Builder *)&u_4.builder.dataSize,(StringPtr)stack0xfffffffffffff130);
  DynamicValue::Builder::as<capnp::DynamicStruct>
            ((BuilderFor<capnp::DynamicStruct> *)local_e80,&local_ec0);
  DynamicValue::Builder::~Builder(&local_ec0);
  DynamicStruct::Builder::which(&local_f60,(Builder *)local_e80);
  pNVar6 = kj::_::readMaybe<capnp::StructSchema::Field>(&local_f60);
  kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)local_f18,pNVar6);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_f60);
  pFVar7 = kj::_::NullableValue::operator_cast_to_Field_((NullableValue *)local_f18);
  if (pFVar7 == (Field *)0x0) {
    local_fe9 = kj::_::Debug::shouldLog(ERROR);
    while( true ) {
      if (local_fe9 == false) break;
      kj::_::Debug::log<char_const(&)[17]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x13b,ERROR,"\"Maybe was empty.\"",(char (*) [17])"Maybe was empty.");
      local_fe9 = false;
    }
  }
  else {
    pFVar7 = kj::_::NullableValue<capnp::StructSchema::Field>::operator->
                       ((NullableValue<capnp::StructSchema::Field> *)local_f18);
    StructSchema::Field::getProto((Reader *)local_fa0,pFVar7);
    local_f70 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)local_fa0);
    bVar1 = kj::operator==("u1f1sp",(StringPtr *)&local_f70);
    if (!bVar1) {
      local_fa1 = kj::_::Debug::shouldLog(ERROR);
      while (local_fa1 != false) {
        pFVar7 = kj::_::NullableValue<capnp::StructSchema::Field>::operator->
                           ((NullableValue<capnp::StructSchema::Field> *)local_f18);
        StructSchema::Field::getProto((Reader *)local_fe8,pFVar7);
        AVar10 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)local_fe8);
        local_fb8 = AVar10;
        kj::_::Debug::log<char_const(&)[57],char_const(&)[7],capnp::Text::Reader>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0x13b,ERROR,
                   "\"failed: expected \" \"(\\\"u1f1sp\\\") == (w->getProto().getName())\", \"u1f1sp\", w->getProto().getName()"
                   ,(char (*) [57])"failed: expected (\"u1f1sp\") == (w->getProto().getName())",
                   (char (*) [7])"u1f1sp",(Reader *)&local_fb8);
        local_fa1 = false;
      }
    }
  }
  kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)local_f18);
  kj::StringPtr::StringPtr((StringPtr *)auStack_1058,"u1f1sp");
  DynamicStruct::Builder::get(&local_1048,(Builder *)local_e80,(StringPtr)_auStack_1058);
  DynamicValue::Builder::as<capnp::Text>(&local_1008,&local_1048);
  bVar1 = capnp::operator==("foo",&local_1008);
  DynamicValue::Builder::~Builder(&local_1048);
  if (!bVar1) {
    local_1059 = kj::_::Debug::shouldLog(ERROR);
    while (local_1059 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&u_6.builder.dataSize,"u1f1sp");
      DynamicStruct::Builder::get
                (&local_10b8,(Builder *)local_e80,(StringPtr)stack0xffffffffffffef38);
      DynamicValue::Builder::as<capnp::Text>(&local_1078,&local_10b8);
      kj::_::Debug::log<char_const(&)[57],char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x13c,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (u.get(\\\"u1f1sp\\\").as<Text>())\", \"foo\", u.get(\"u1f1sp\").as<Text>()"
                 ,(char (*) [57])"failed: expected (\"foo\") == (u.get(\"u1f1sp\").as<Text>())",
                 (char (*) [4])0xa4c8db,&local_1078);
      DynamicValue::Builder::~Builder(&local_10b8);
      local_1059 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&w_6.field_1.value.proto._reader.nestingLimit,"union2");
  DynamicStruct::Builder::get
            (&local_1138,(Builder *)&u_4.builder.dataSize,(StringPtr)stack0xffffffffffffeeb8);
  DynamicValue::Builder::as<capnp::DynamicStruct>
            ((BuilderFor<capnp::DynamicStruct> *)local_10f8,&local_1138);
  DynamicValue::Builder::~Builder(&local_1138);
  DynamicStruct::Builder::which(&local_11d8,(Builder *)local_10f8);
  pNVar6 = kj::_::readMaybe<capnp::StructSchema::Field>(&local_11d8);
  kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)local_1190,pNVar6);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_11d8);
  pFVar7 = kj::_::NullableValue::operator_cast_to_Field_((NullableValue *)local_1190);
  if (pFVar7 == (Field *)0x0) {
    local_1261 = kj::_::Debug::shouldLog(ERROR);
    while( true ) {
      if (local_1261 == false) break;
      kj::_::Debug::log<char_const(&)[17]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x140,ERROR,"\"Maybe was empty.\"",(char (*) [17])"Maybe was empty.");
      local_1261 = false;
    }
  }
  else {
    pFVar7 = kj::_::NullableValue<capnp::StructSchema::Field>::operator->
                       ((NullableValue<capnp::StructSchema::Field> *)local_1190);
    StructSchema::Field::getProto((Reader *)local_1218,pFVar7);
    local_11e8 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)local_1218);
    bVar1 = kj::operator==("u2f0s1",(StringPtr *)&local_11e8);
    if (!bVar1) {
      local_1219 = kj::_::Debug::shouldLog(ERROR);
      while (local_1219 != false) {
        pFVar7 = kj::_::NullableValue<capnp::StructSchema::Field>::operator->
                           ((NullableValue<capnp::StructSchema::Field> *)local_1190);
        StructSchema::Field::getProto((Reader *)local_1260,pFVar7);
        AVar10 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)local_1260);
        local_1230 = AVar10;
        kj::_::Debug::log<char_const(&)[57],char_const(&)[7],capnp::Text::Reader>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0x140,ERROR,
                   "\"failed: expected \" \"(\\\"u2f0s1\\\") == (w->getProto().getName())\", \"u2f0s1\", w->getProto().getName()"
                   ,(char (*) [57])"failed: expected (\"u2f0s1\") == (w->getProto().getName())",
                   (char (*) [7])"u2f0s1",(Reader *)&local_1230);
        local_1219 = false;
      }
    }
  }
  kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)local_1190);
  kj::StringPtr::StringPtr((StringPtr *)auStack_12b8,"u2f0s1");
  DynamicStruct::Builder::get(&local_12a8,(Builder *)local_10f8,(StringPtr)_auStack_12b8);
  BVar3 = DynamicValue::Builder::as<bool>(&local_12a8);
  DynamicValue::Builder::~Builder(&local_12a8);
  if (!BVar3) {
    u_7.builder._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (u_7.builder._39_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[44]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x141,ERROR,"\"failed: expected \" \"u.get(\\\"u2f0s1\\\").as<bool>()\"",
                 (char (*) [44])"failed: expected u.get(\"u2f0s1\").as<bool>()");
      u_7.builder._39_1_ = 0;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&w_7.field_1.value.proto._reader.nestingLimit,"union3");
  DynamicStruct::Builder::get
            (&local_1330,(Builder *)&u_4.builder.dataSize,(StringPtr)stack0xffffffffffffecc0);
  DynamicValue::Builder::as<capnp::DynamicStruct>
            ((BuilderFor<capnp::DynamicStruct> *)local_12f0,&local_1330);
  DynamicValue::Builder::~Builder(&local_1330);
  DynamicStruct::Builder::which(&local_13d0,(Builder *)local_12f0);
  pNVar6 = kj::_::readMaybe<capnp::StructSchema::Field>(&local_13d0);
  kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)local_1388,pNVar6);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_13d0);
  pFVar7 = kj::_::NullableValue::operator_cast_to_Field_((NullableValue *)local_1388);
  if (pFVar7 == (Field *)0x0) {
    local_1459 = kj::_::Debug::shouldLog(ERROR);
    while( true ) {
      if (local_1459 == false) break;
      kj::_::Debug::log<char_const(&)[17]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x145,ERROR,"\"Maybe was empty.\"",(char (*) [17])"Maybe was empty.");
      local_1459 = false;
    }
  }
  else {
    pFVar7 = kj::_::NullableValue<capnp::StructSchema::Field>::operator->
                       ((NullableValue<capnp::StructSchema::Field> *)local_1388);
    StructSchema::Field::getProto((Reader *)local_1410,pFVar7);
    local_13e0 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)local_1410);
    bVar1 = kj::operator==("u3f0s64",(StringPtr *)&local_13e0);
    if (!bVar1) {
      local_1411 = kj::_::Debug::shouldLog(ERROR);
      while (local_1411 != false) {
        pFVar7 = kj::_::NullableValue<capnp::StructSchema::Field>::operator->
                           ((NullableValue<capnp::StructSchema::Field> *)local_1388);
        StructSchema::Field::getProto((Reader *)local_1458,pFVar7);
        AVar10 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)local_1458);
        local_1428 = AVar10;
        kj::_::Debug::log<char_const(&)[58],char_const(&)[8],capnp::Text::Reader>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0x145,ERROR,
                   "\"failed: expected \" \"(\\\"u3f0s64\\\") == (w->getProto().getName())\", \"u3f0s64\", w->getProto().getName()"
                   ,(char (*) [58])"failed: expected (\"u3f0s64\") == (w->getProto().getName())",
                   (char (*) [8])"u3f0s64",(Reader *)&local_1428);
        local_1411 = false;
      }
    }
  }
  kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)local_1388);
  kj::StringPtr::StringPtr((StringPtr *)auStack_14b0,"u3f0s64");
  DynamicStruct::Builder::get(&local_14a0,(Builder *)local_12f0,(StringPtr)_auStack_14b0);
  BVar9 = DynamicValue::Builder::as<long>(&local_14a0);
  DynamicValue::Builder::~Builder(&local_14a0);
  if (BVar9 != 0x112210f47de98115) {
    local_14b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_14b1 != false) {
      local_14c0 = 0x112210f47de98115;
      kj::StringPtr::StringPtr((StringPtr *)&local_1518,"u3f0s64");
      DynamicStruct::Builder::get(&local_1508,(Builder *)local_12f0,(StringPtr)local_1518);
      local_14c8 = DynamicValue::Builder::as<long>(&local_1508);
      kj::_::Debug::log<char_const(&)[77],long_long,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x146,ERROR,
                 "\"failed: expected \" \"(1234567890123456789ll) == (u.get(\\\"u3f0s64\\\").as<int64_t>())\", 1234567890123456789ll, u.get(\"u3f0s64\").as<int64_t>()"
                 ,(char (*) [77])
                  "failed: expected (1234567890123456789ll) == (u.get(\"u3f0s64\").as<int64_t>())",
                 &local_14c0,&local_14c8);
      DynamicValue::Builder::~Builder(&local_1508);
      local_14b1 = false;
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(DynamicApi, UnionsRead) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestUnion>();

  root.getUnion0().setU0f1s32(1234567);
  root.getUnion1().setU1f1sp("foo");
  root.getUnion2().setU2f0s1(true);
  root.getUnion3().setU3f0s64(1234567890123456789ll);

  {
    auto dynamic = toDynamic(root.asReader());
    {
      auto u = dynamic.get("union0").as<DynamicStruct>();
      EXPECT_MAYBE_EQ(w, u.which(), "u0f1s32", w->getProto().getName());
      EXPECT_EQ(1234567, u.get("u0f1s32").as<int32_t>());
    }
    {
      auto u = dynamic.get("union1").as<DynamicStruct>();
      EXPECT_MAYBE_EQ(w, u.which(), "u1f1sp", w->getProto().getName());
      EXPECT_EQ("foo", u.get("u1f1sp").as<Text>());
    }
    {
      auto u = dynamic.get("union2").as<DynamicStruct>();
      EXPECT_MAYBE_EQ(w, u.which(), "u2f0s1", w->getProto().getName());
      EXPECT_TRUE(u.get("u2f0s1").as<bool>());
    }
    {
      auto u = dynamic.get("union3").as<DynamicStruct>();
      EXPECT_MAYBE_EQ(w, u.which(), "u3f0s64", w->getProto().getName());
      EXPECT_EQ(1234567890123456789ll, u.get("u3f0s64").as<int64_t>());
    }
  }

  {
    // Again as a builder.
    auto dynamic = toDynamic(root);
    {
      auto u = dynamic.get("union0").as<DynamicStruct>();
      EXPECT_MAYBE_EQ(w, u.which(), "u0f1s32", w->getProto().getName());
      EXPECT_EQ(1234567, u.get("u0f1s32").as<int32_t>());
    }
    {
      auto u = dynamic.get("union1").as<DynamicStruct>();
      EXPECT_MAYBE_EQ(w, u.which(), "u1f1sp", w->getProto().getName());
      EXPECT_EQ("foo", u.get("u1f1sp").as<Text>());
    }
    {
      auto u = dynamic.get("union2").as<DynamicStruct>();
      EXPECT_MAYBE_EQ(w, u.which(), "u2f0s1", w->getProto().getName());
      EXPECT_TRUE(u.get("u2f0s1").as<bool>());
    }
    {
      auto u = dynamic.get("union3").as<DynamicStruct>();
      EXPECT_MAYBE_EQ(w, u.which(), "u3f0s64", w->getProto().getName());
      EXPECT_EQ(1234567890123456789ll, u.get("u3f0s64").as<int64_t>());
    }
  }
}